

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall compiler::CompilerAstWalker::popEmissionContext(CompilerAstWalker *this)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer *ppVVar3;
  string local_58;
  element_type *local_38;
  shared_ptr<compiler::EmissionContext> outer;
  
  peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (peVar1->outerContext).
           super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  outer.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (peVar1->outerContext).
       super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (outer.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ppVVar3 = (pointer *)
                ((long)&((outer.
                          super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->variables).
                        super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                        ._M_impl.super__Vector_impl_data + 8);
      *(int *)ppVVar3 = *(int *)ppVVar3 + 1;
      UNLOCK();
    }
    else {
      ppVVar3 = (pointer *)
                ((long)&((outer.
                          super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->variables).
                        super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                        ._M_impl.super__Vector_impl_data + 8);
      *(int *)ppVVar3 = *(int *)ppVVar3 + 1;
    }
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = peVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"popEmissionContext called when outer context is none!","");
  Error::assertWithPanic(peVar2 != (element_type *)0x0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&outer);
  if (outer.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               outer.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  return;
}

Assistant:

void popEmissionContext() noexcept {
    auto outer = this->ec->outerContext;
    Error::assertWithPanic(outer != nullptr, "popEmissionContext called when outer context is none!");
    this->ec = outer;
  }